

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

string * __thiscall
rcg::Device::getDisplayName_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  DEVICE_INFO_CMD in_R8D;
  string local_40;
  
  std::mutex::lock(&this->mtx);
  (anonymous_namespace)::cDevGetInfo_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
             (shared_ptr<const_rcg::GenTLWrapper> *)0x6,in_R8D);
  if (__return_storage_ptr__->_M_string_length == 0) {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
               (shared_ptr<const_rcg::GenTLWrapper> *)0x4,in_R8D);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string Device::getDisplayName()
{
  std::lock_guard<std::mutex> lock(mtx);

  // return user defined name if available, otherwise the display name that
  // the producer provides

  std::string ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_USER_DEFINED_NAME);

  if (ret.size() == 0)
  {
    ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_DISPLAYNAME);
  }

  return ret;
}